

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void boost::unordered::detail::foa::
     table_arrays<std::pair<const_slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
     ::delete_(allocator_type al,
              table_arrays<std::pair<const_slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
              *arrays)

{
  short *psVar1;
  byte bVar2;
  mi_segment_t *segment;
  long lVar3;
  ulong uVar4;
  mi_segment_t *segment_00;
  allocator_type sal;
  mi_page_t *page;
  mi_threadid_t *in_FS_OFFSET;
  
  segment = (mi_segment_t *)arrays->elements_;
  if (segment != (mi_segment_t *)0x0) {
    if (&(al.storage)->ptr < segment || segment < al.storage) {
      segment_00 = (mi_segment_t *)
                   ((ulong)((long)segment[-1].slices[0x200].padding + 7U) & 0xfffffffffe000000);
      if (0 < (long)segment_00) {
        uVar4 = (ulong)((long)segment - (long)segment_00) >> 0x10;
        lVar3 = uVar4 * 0x60 - (ulong)segment_00->slices[uVar4].slice_offset;
        page = (mi_page_t *)((long)segment_00 + lVar3 + 0x120);
        if (segment_00->thread_id != *in_FS_OFFSET) {
          uVar4 = (long)segment - *(long *)((long)segment_00 + lVar3 + 0x150);
          bVar2 = *(byte *)((long)segment_00 + lVar3 + 0x142);
          if (bVar2 == 0) {
            uVar4 = uVar4 % *(ulong *)((long)segment_00 + lVar3 + 0x148);
          }
          else {
            uVar4 = uVar4 & ~(-1L << (bVar2 & 0x3f));
          }
          mi_free_block_mt(page,segment_00,(mi_block_t *)((long)segment - uVar4));
          return;
        }
        if (*(char *)((long)segment_00 + lVar3 + 0x12e) != '\0') {
          mi_free_generic_local(page,segment,segment);
          return;
        }
        (segment->memid).mem.os.base = *(void **)((long)segment_00 + lVar3 + 0x138);
        *(mi_segment_t **)((long)segment_00 + lVar3 + 0x138) = segment;
        psVar1 = (short *)((long)segment_00 + lVar3 + 0x140);
        *psVar1 = *psVar1 + -1;
        if (*psVar1 == 0) {
          _mi_page_retire(page);
          return;
        }
      }
      return;
    }
    if ((char *)((long)segment->slices + arrays->groups_size_mask * 0x100 + -0x20) ==
        (al.storage)->ptr) {
      (al.storage)->ptr = (char *)segment;
      return;
    }
  }
  return;
}

Assistant:

static void delete_(allocator_type al, table_arrays& arrays) noexcept {
        using storage_traits = std::allocator_traits<allocator_type>;

        auto sal = allocator_type(al);
        if (arrays.elements()) {
            storage_traits::deallocate(sal, arrays.elements_,
                                       buffer_size(arrays.groups_size_mask + 1));
        }
    }